

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-test.capnp.h
# Opt level: O0

Builder __thiscall capnp::TestBase64Union::Builder::initFoo(Builder *this,uint size)

{
  ArrayPtr<unsigned_char> AVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t extraout_RDX;
  PointerBuilder local_40;
  uint local_24;
  Builder *pBStack_20;
  uint size_local;
  Builder *this_local;
  
  local_24 = size;
  pBStack_20 = this;
  uVar2 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::TestBase64Union::Which>(&this->_builder,uVar2,FOO);
  uVar2 = bounded<0u>();
  capnp::_::StructBuilder::getPointerField(&local_40,&this->_builder,uVar2);
  iVar3 = capnp::_::PointerHelpers<capnp::Data,_(capnp::Kind)1>::init
                    ((EVP_PKEY_CTX *)(ulong)local_24);
  AVar1.ptr._4_4_ = extraout_var;
  AVar1.ptr._0_4_ = iVar3;
  AVar1.size_ = extraout_RDX;
  return (Builder)AVar1;
}

Assistant:

inline  ::capnp::Data::Builder TestBase64Union::Builder::initFoo(unsigned int size) {
  _builder.setDataField<TestBase64Union::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, TestBase64Union::FOO);
  return ::capnp::_::PointerHelpers< ::capnp::Data>::init(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS), size);
}